

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteVar(WatWriter *this,Var *var,NextChar next_char)

{
  string_view str;
  
  if (var->type_ == Name) {
    str._M_str = (var->field_2).name_._M_dataplus._M_p;
    str._M_len = (var->field_2).name_._M_string_length;
    WriteName(this,str,next_char);
    return;
  }
  if (var->type_ == Index) {
    Writef(this,"%u",(ulong)(var->field_2).index_);
    this->next_char_ = next_char;
    return;
  }
  __assert_fail("is_name()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/ir.h"
                ,0x3e,"const std::string &wabt::Var::name() const");
}

Assistant:

void WatWriter::WriteVar(const Var& var, NextChar next_char) {
  if (var.is_index()) {
    Writef("%" PRIindex, var.index());
    next_char_ = next_char;
  } else {
    WriteName(var.name(), next_char);
  }
}